

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O2

size_t __thiscall meshopt::VertexStreamHasher::hash(VertexStreamHasher *this,uint index)

{
  uint h;
  size_t *psVar1;
  size_t sVar2;
  bool bVar3;
  
  sVar2 = this->stream_count;
  psVar1 = &this->streams->stride;
  h = 0;
  while (bVar3 = sVar2 != 0, sVar2 = sVar2 - 1, bVar3) {
    h = hashUpdate4(h,(uchar *)(*psVar1 * (ulong)index +
                               (long)((meshopt_Stream *)(psVar1 + -2))->data),psVar1[-1]);
    psVar1 = psVar1 + 3;
  }
  return (ulong)h;
}

Assistant:

size_t hash(unsigned int index) const
	{
		unsigned int h = 0;

		for (size_t i = 0; i < stream_count; ++i)
		{
			const meshopt_Stream& s = streams[i];
			const unsigned char* data = static_cast<const unsigned char*>(s.data);

			h = hashUpdate4(h, data + index * s.stride, s.size);
		}

		return h;
	}